

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O1

void Abc_NtkCycleInitState(Abc_Ntk_t *pNtk,int nFrames,int fUseXval,int fVerbose)

{
  long *plVar1;
  void *pvVar2;
  undefined8 *puVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  char *__assertion;
  int iVar12;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                  ,0xc4,"void Abc_NtkCycleInitState(Abc_Ntk_t *, int, int, int)");
  }
  Gia_ManRandom(1);
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x2;
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      plVar1 = (long *)pVVar7->pArray[lVar6];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        *(long *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8)
                 + 0x40) = (long)(int)plVar1[7];
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNtk->vBoxes;
    } while (lVar6 < pVVar7->nSize);
  }
  if (0 < nFrames) {
    iVar12 = 0;
    do {
      pVVar7 = pNtk->vPis;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          pvVar2 = pVVar7->pArray[lVar6];
          lVar8 = 3;
          if (fUseXval == 0) {
            uVar4 = Gia_ManRandom(0);
            lVar8 = (ulong)(uVar4 & 1) + 1;
          }
          *(long *)((long)pvVar2 + 0x40) = lVar8;
          lVar6 = lVar6 + 1;
          pVVar7 = pNtk->vPis;
        } while (lVar6 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vObjs;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          puVar3 = (undefined8 *)pVVar7->pArray[lVar6];
          if (puVar3 != (undefined8 *)0x0) {
            if (((ulong)puVar3 & 1) != 0) {
              __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0031fcae:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
            }
            if (*(int *)*puVar3 != 3) {
              __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
              goto LAB_0031fcae;
            }
            if (*(int *)((long)puVar3 + 0x1c) == 2) {
              lVar8 = *(long *)(*(long *)((int *)*puVar3 + 8) + 8);
              iVar9 = *(int *)(*(long *)(lVar8 + (long)*(int *)puVar3[4] * 8) + 0x40);
              if ((*(uint *)((long)puVar3 + 0x14) >> 10 & 1) != 0) {
                if (2 < iVar9 - 1U) goto LAB_0031fc7f;
                iVar9 = *(int *)(&DAT_0098738c + (ulong)(iVar9 - 1U) * 4);
              }
              iVar10 = *(int *)(*(long *)(lVar8 + (long)((int *)puVar3[4])[1] * 8) + 0x40);
              if ((*(uint *)((long)puVar3 + 0x14) >> 0xb & 1) != 0) {
                if (2 < iVar10 - 1U) goto LAB_0031fc7f;
                iVar10 = *(int *)(&DAT_0098738c + (ulong)(iVar10 - 1U) * 4);
              }
              uVar11 = 1;
              if ((((iVar9 != 1) && (iVar10 != 1)) && (uVar11 = 3, iVar9 != 3)) &&
                 ((iVar10 != 3 && ((iVar9 != 2 || (uVar11 = 2, iVar10 != 2)))))) {
                __assert_fail("Value0 == XVS1 && Value1 == XVS1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                              ,0x33,"int Abc_XsimAnd(int, int)");
              }
              puVar3[8] = uVar11;
            }
          }
          lVar6 = lVar6 + 1;
          pVVar7 = pNtk->vObjs;
        } while (lVar6 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vCos;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar6];
          iVar9 = (int)*(undefined8 *)
                        (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8) + 0x40);
          if ((*(byte *)((long)plVar1 + 0x15) & 4) != 0) {
            if (2 < iVar9 - 1U) {
LAB_0031fc7f:
              __assert_fail("Value == XVSX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                            ,0x2a,"int Abc_XsimInv(int)");
            }
            iVar9 = (int)*(undefined8 *)(&DAT_00987398 + (ulong)(iVar9 - 1U) * 8);
          }
          plVar1[8] = (long)iVar9;
          lVar6 = lVar6 + 1;
          pVVar7 = pNtk->vCos;
        } while (lVar6 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar6];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            lVar8 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
            *(long *)(*(long *)(lVar8 + (long)*(int *)plVar1[6] * 8) + 0x40) =
                 (long)*(int *)(*(long *)(lVar8 + (long)*(int *)plVar1[4] * 8) + 0x40);
          }
          lVar6 = lVar6 + 1;
          pVVar7 = pNtk->vBoxes;
        } while (lVar6 < pVVar7->nSize);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != nFrames);
  }
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      plVar1 = (long *)pVVar7->pArray[lVar6];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        plVar1[7] = (long)*(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                            (long)*(int *)plVar1[6] * 8) + 0x40);
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pNtk->vBoxes;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCycleInitState( Abc_Ntk_t * pNtk, int nFrames, int fUseXval, int fVerbose )
{ 
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsStrash(pNtk) );
//    srand( 0x12341234 );
    Gia_ManRandom( 1 );
    // initialize the values
    Abc_ObjSetXsim( Abc_AigConst1(pNtk), XVS1 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_LatchInit(pObj) );
    // simulate for the given number of timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, fUseXval? ABC_INIT_DC : Abc_XsimRand2() );
//            Abc_ObjSetXsim( pObj, ABC_INIT_ONE );
        Abc_AigForEachAnd( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_XsimAnd(Abc_ObjGetXsimFanin0(pObj), Abc_ObjGetXsimFanin1(pObj)) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_ObjGetXsimFanin0(pObj) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_ObjGetXsim(Abc_ObjFanin0(pObj)) );
    }
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pObj->pData = (void *)(ABC_PTRINT_T)Abc_ObjGetXsim(Abc_ObjFanout0(pObj));
//        printf( "%d", Abc_LatchIsInit1(pObj) );
    }
//    printf( "\n" );
}